

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O3

bool __thiscall ecjacobian::calcy(ecjacobian *this,bool ybit)

{
  char extraout_AL;
  bool bVar1;
  gfield *pgVar2;
  bigint<13> *y;
  double __x;
  gfield tmp;
  gfield y2;
  bigint<26> local_80;
  bigint<13> local_48;
  
  bigint<26>::mul<13,13>(&local_80,(bigint<13> *)this,(bigint<13> *)this);
  gfield::reduce<26>((gfield *)&local_48,&local_80);
  bigint<26>::mul<13,13>(&local_80,&local_48,(bigint<13> *)this);
  gfield::reduce<26>((gfield *)&local_48,&local_80);
  pgVar2 = gfield::add<13,13>((gfield *)&local_80,(bigint<13> *)this,(bigint<13> *)this);
  y = &gfield::add<13,13>(pgVar2,&pgVar2->super_gfint,(bigint<13> *)this)->super_gfint;
  pgVar2 = gfield::sub<13,13>((gfield *)&local_48,&local_48,y);
  gfield::add<13,13>(pgVar2,&pgVar2->super_gfint,&B.super_gfint);
  pgVar2 = &this->y;
  gfield::sqrt(pgVar2,__x);
  bVar1 = (bool)extraout_AL;
  if (extraout_AL == '\0') {
    (pgVar2->super_gfint).len = 0;
  }
  else {
    if ((pgVar2->super_gfint).len < 1) {
      if (!ybit) {
        return bVar1;
      }
    }
    else if ((bool)((byte)(this->y).super_gfint.digits[0] & 1) == ybit) {
      return bVar1;
    }
    bigint<13>::sub<13,13>(&pgVar2->super_gfint,&gfield::P.super_gfint,&pgVar2->super_gfint);
  }
  return bVar1;
}

Assistant:

bool calcy(bool ybit)
    {
        gfield y2, tmp;
        y2.square(x).mul(x).sub(tmp.add(x, x).add(x)).add(B);
        if(!y.sqrt(y2)) { y.zero(); return false; }
        if(y.hasbit(0) != ybit) y.neg();
        return true;
    }